

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmemory.c
# Opt level: O2

int dQuerySpace(SuperMatrix *L,SuperMatrix *U,mem_usage_t *mem_usage)

{
  float fVar1;
  float fVar2;
  int iVar3;
  long lVar4;
  float fVar5;
  
  iVar3 = sp_ienv(1);
  lVar4 = (long)L->ncol;
  fVar2 = (float)L->ncol;
  fVar1 = (float)iVar3;
  fVar5 = (fVar2 + 1.0) * 4.0 +
          (float)(*(int *)(*(long *)((long)U->Store + 0x18) + lVar4 * 4) * 0xc) +
          (float)(*(int *)(*(long *)((long)L->Store + 0x20) + lVar4 * 4) << 2) +
          (fVar2 * 4.0 + 3.0) * 4.0 +
          (float)(*(int *)(*(long *)((long)L->Store + 0x10) + lVar4 * 4) << 3);
  mem_usage->for_lu = fVar5;
  mem_usage->total_needed =
       (fVar1 + fVar1 + 4.0 + 3.0) * fVar2 * 4.0 + (fVar1 + 1.0) * fVar2 * 8.0 + fVar5;
  return 0;
}

Assistant:

int dQuerySpace(SuperMatrix *L, SuperMatrix *U, mem_usage_t *mem_usage)
{
    SCformat *Lstore;
    NCformat *Ustore;
    register int n, iword, dword, panel_size = sp_ienv(1);

    Lstore = L->Store;
    Ustore = U->Store;
    n = L->ncol;
    iword = sizeof(int);
    dword = sizeof(double);

    /* For LU factors */
    mem_usage->for_lu = (float)( (4.0*n + 3.0) * iword +
                                 Lstore->nzval_colptr[n] * dword +
                                 Lstore->rowind_colptr[n] * iword );
    mem_usage->for_lu += (float)( (n + 1.0) * iword +
				 Ustore->colptr[n] * (dword + iword) );

    /* Working storage to support factorization */
    mem_usage->total_needed = mem_usage->for_lu +
	(float)( (2.0 * panel_size + 4.0 + NO_MARKER) * n * iword +
		(panel_size + 1.0) * n * dword );

    return 0;
}